

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Reader reader;
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffbf8;
  bool local_3d1;
  undefined1 local_3d0 [7];
  bool _kj_shouldLog_12;
  uint local_3a4 [2];
  bool local_399;
  undefined1 local_398 [7];
  bool _kj_shouldLog_11;
  bool local_369;
  undefined1 local_368 [7];
  bool _kj_shouldLog_10;
  uint local_334 [2];
  bool local_329;
  undefined1 local_328 [7];
  bool _kj_shouldLog_9;
  bool local_2f1;
  undefined1 local_2f0 [7];
  bool _kj_shouldLog_8;
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> orphan_2;
  undefined1 local_2c8 [7];
  bool _kj_shouldLog_7;
  uint local_29c [2];
  bool local_291;
  undefined1 local_290 [7];
  bool _kj_shouldLog_6;
  bool local_261;
  undefined1 local_260 [7];
  bool _kj_shouldLog_5;
  uint local_22c [2];
  bool local_221;
  undefined1 local_220 [7];
  bool _kj_shouldLog_4;
  bool local_1e9;
  undefined1 local_1e8 [7];
  bool _kj_shouldLog_3;
  Orphan<capnp::List<int,_(capnp::Kind)0>_> orphan_1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_2;
  CapTableBuilder *pCStack_1b8;
  void *local_1b0;
  WirePointer *pWStack_1a8;
  undefined8 local_1a0;
  bool local_191;
  undefined1 auStack_190 [7];
  bool _kj_shouldLog_1;
  CapTableReader *pCStack_188;
  void *local_180;
  WirePointer *pWStack_178;
  undefined8 local_170;
  int iStack_168;
  undefined2 uStack_164;
  undefined2 uStack_162;
  bool local_159;
  undefined1 local_158 [7];
  bool _kj_shouldLog;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase881 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158,(Builder *)local_128);
  bVar1 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158,(void *)0x0);
  if (!bVar1) {
    local_159 = kj::_::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x377,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_159 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAllTypes>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestAllTypes> *)auStack_190,
             (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158);
  reader._reader.capTable = (CapTableReader *)local_180;
  reader._reader.segment = (SegmentReader *)pCStack_188;
  reader._reader.data = pWStack_178;
  reader._reader.pointers = (WirePointer *)local_170;
  reader._reader.dataSize = iStack_168;
  reader._reader.pointerCount = uStack_164;
  reader._reader._38_2_ = uStack_162;
  reader._reader._40_8_ = in_stack_fffffffffffffbf8;
  checkTestMessageAllZero(reader);
  bVar1 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158,(void *)0x0);
  uVar3 = _iStack_168;
  if (!bVar1) {
    local_191 = kj::_::Debug::shouldLog(ERROR);
    uVar3 = _iStack_168;
    while (local_191 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x37a,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_191 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)auStack_1c0,
             (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158);
  builder_00._builder.capTable = (CapTableBuilder *)local_1b0;
  builder_00._builder.segment = (SegmentBuilder *)pCStack_1b8;
  builder_00._builder.data = pWStack_1a8;
  builder_00._builder.pointers = (WirePointer *)local_1a0;
  builder_00._builder.dataSize = (int)uVar3;
  builder_00._builder.pointerCount = SUB82(uVar3,4);
  builder_00._builder._38_2_ = SUB82(uVar3,6);
  checkTestMessageAllZero(builder_00);
  bVar1 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158,(void *)0x0);
  if (bVar1) {
    orphan_1.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan_1.builder.location._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x37e,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
      orphan_1.builder.location._7_1_ = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_158);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownInt32List
            ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8,(Builder *)local_128);
  bVar1 = Orphan<capnp::List<int,_(capnp::Kind)0>_>::operator==
                    ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8,(void *)0x0);
  if (!bVar1) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,899,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_1e9 = false;
    }
  }
  Orphan<capnp::List<int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<int,_(capnp::Kind)0>_> *)local_220,
             (Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8);
  uVar2 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_220);
  if (uVar2 != 0) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      local_22c[1] = 0;
      Orphan<capnp::List<int,_(capnp::Kind)0>_>::getReader
                ((ReaderFor<capnp::List<int,_(capnp::Kind)0>_> *)local_260,
                 (Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8);
      local_22c[0] = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_260);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x385,ERROR,
                 "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
                 ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",
                 (int *)(local_22c + 1),local_22c);
      local_221 = false;
    }
  }
  bVar1 = Orphan<capnp::List<int,_(capnp::Kind)0>_>::operator==
                    ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8,(void *)0x0);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x386,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_261 = false;
    }
  }
  Orphan<capnp::List<int,_(capnp::Kind)0>_>::get
            ((BuilderFor<capnp::List<int,_(capnp::Kind)0>_> *)local_290,
             (Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8);
  uVar2 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_290);
  if (uVar2 != 0) {
    local_291 = kj::_::Debug::shouldLog(ERROR);
    while (local_291 != false) {
      local_29c[1] = 0;
      Orphan<capnp::List<int,_(capnp::Kind)0>_>::get
                ((BuilderFor<capnp::List<int,_(capnp::Kind)0>_> *)local_2c8,
                 (Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8);
      local_29c[0] = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_2c8);
      kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x388,ERROR,
                 "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
                 (char (*) [46])"failed: expected (0) == (orphan.get().size())",
                 (int *)(local_29c + 1),local_29c);
      local_291 = false;
    }
  }
  bVar1 = Orphan<capnp::List<int,_(capnp::Kind)0>_>::operator==
                    ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8,(void *)0x0);
  if (!bVar1) {
    orphan_2.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan_2.builder.location._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x389,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      orphan_2.builder.location._7_1_ = false;
    }
  }
  Orphan<capnp::List<int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<int,_(capnp::Kind)0>_> *)local_1e8);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructList
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_2f0,(Builder *)local_128);
  bVar1 = Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::
          operator==((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_2f0,(void *)0x0);
  if (!bVar1) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x38e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_2f1 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_328,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_2f0);
  uVar2 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_328);
  if (uVar2 != 0) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      local_334[1] = 0;
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
                ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                  *)local_368,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_2f0);
      local_334[0] = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                               ((Reader *)local_368);
      kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x390,ERROR,
                 "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
                 ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",
                 (int *)(local_334 + 1),local_334);
      local_329 = false;
    }
  }
  bVar1 = Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::
          operator==((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_2f0,(void *)0x0);
  if (!bVar1) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x391,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_369 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_398,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_2f0);
  uVar2 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_398);
  if (uVar2 != 0) {
    local_399 = kj::_::Debug::shouldLog(ERROR);
    while (local_399 != false) {
      local_3a4[1] = 0;
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
                ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                  *)local_3d0,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_2f0);
      local_3a4[0] = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                               ((Builder *)local_3d0);
      kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x393,ERROR,
                 "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
                 (char (*) [46])"failed: expected (0) == (orphan.get().size())",
                 (int *)(local_3a4 + 1),local_3a4);
      local_399 = false;
    }
  }
  bVar1 = Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::
          operator==((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_2f0,(void *)0x0);
  if (!bVar1) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d1 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x394,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_3d1 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::~Orphan
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_2f0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}